

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basewindow_x11.cc
# Opt level: O3

void __thiscall
bgui::PaintBufferFct::PaintBufferFct
          (PaintBufferFct *this,BaseWindowData *_p,ImageAdapterBase *_im,int _x,int _y)

{
  XImage *pXVar1;
  undefined4 extraout_var;
  long lVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  
  (this->super_ParallelFunction)._vptr_ParallelFunction = (_func_int **)&PTR_run_00163378;
  this->p = _p;
  this->im = _im;
  this->x = _x;
  this->y = _y;
  pXVar1 = _p->image;
  uVar4 = 0xfffffffe;
  do {
    uVar3 = uVar4 + 2;
    uVar4 = uVar4 + 1;
    if (0x1f < uVar3) break;
  } while (((long)(1 << ((byte)uVar3 & 0x1f)) & pXVar1->red_mask) == 0);
  do {
    uVar4 = uVar4 + 1;
    if (0x1f < uVar4) break;
  } while (((long)(1 << ((byte)uVar4 & 0x1f)) & pXVar1->red_mask) != 0);
  if (0x1f < uVar4) {
    uVar4 = 0;
  }
  iVar5 = -(uVar4 - 8);
  if (7 < uVar4) {
    iVar5 = 0;
  }
  iVar7 = uVar4 - 8;
  if (uVar4 < 8) {
    iVar7 = 0;
  }
  this->rls = iVar7;
  this->rrs = iVar5;
  uVar4 = 0xfffffffe;
  do {
    uVar3 = uVar4 + 2;
    uVar4 = uVar4 + 1;
    if (0x1f < uVar3) break;
  } while (((long)(1 << ((byte)uVar3 & 0x1f)) & pXVar1->green_mask) == 0);
  do {
    uVar4 = uVar4 + 1;
    if (0x1f < uVar4) break;
  } while (((long)(1 << ((byte)uVar4 & 0x1f)) & pXVar1->green_mask) != 0);
  if (0x1f < uVar4) {
    uVar4 = 0;
  }
  iVar5 = -(uVar4 - 8);
  if (7 < uVar4) {
    iVar5 = 0;
  }
  iVar7 = uVar4 - 8;
  if (uVar4 < 8) {
    iVar7 = 0;
  }
  this->gls = iVar7;
  this->grs = iVar5;
  uVar4 = 0xfffffffe;
  do {
    uVar3 = uVar4 + 2;
    uVar4 = uVar4 + 1;
    if (0x1f < uVar3) break;
  } while (((long)(1 << ((byte)uVar3 & 0x1f)) & pXVar1->blue_mask) == 0);
  do {
    uVar4 = uVar4 + 1;
    if (0x1f < uVar4) break;
  } while (((long)(1 << ((byte)uVar4 & 0x1f)) & pXVar1->blue_mask) != 0);
  uVar3 = 0;
  if (0x1f < uVar4) {
    uVar4 = uVar3;
  }
  uVar6 = -(uVar4 - 8);
  if (7 < uVar4) {
    uVar6 = uVar3;
  }
  uVar8 = uVar4 - 8;
  if (uVar4 < 8) {
    uVar8 = uVar3;
  }
  this->bls = uVar8;
  this->brs = uVar6;
  iVar5 = pXVar1->width;
  iVar7 = (*_im->_vptr_ImageAdapterBase[0xb])(_im);
  lVar2 = CONCAT44(extraout_var,iVar7) + (long)_x;
  if (iVar5 <= lVar2) {
    lVar2 = (long)iVar5;
  }
  this->w = (int)lVar2;
  return;
}

Assistant:

PaintBufferFct(BaseWindowData *_p, const ImageAdapterBase &_im, int _x, int _y) :
      p(_p), im(_im), x(_x), y(_y)
    {
      // store image in buffer

      getShiftFromMask(p->image->red_mask, rls, rrs);
      getShiftFromMask(p->image->green_mask, gls, grs);
      getShiftFromMask(p->image->blue_mask, bls, brs);

      w=std::min(static_cast<long>(p->image->width), x+im.getWidth());
    }